

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O2

void png_set_rows(png_const_structrp png_ptr,png_inforp info_ptr,png_bytepp row_pointers)

{
  byte *pbVar1;
  
  if (info_ptr != (png_inforp)0x0 && png_ptr != (png_const_structrp)0x0) {
    if (info_ptr->row_pointers != row_pointers && info_ptr->row_pointers != (png_bytepp)0x0) {
      png_free_data(png_ptr,info_ptr,0x40,0);
    }
    info_ptr->row_pointers = row_pointers;
    if (row_pointers != (png_bytepp)0x0) {
      pbVar1 = (byte *)((long)&info_ptr->valid + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
  }
  return;
}

Assistant:

void PNGAPI
png_set_rows(png_const_structrp png_ptr, png_inforp info_ptr,
    png_bytepp row_pointers)
{
   png_debug(1, "in png_set_rows");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   if (info_ptr->row_pointers != NULL &&
       (info_ptr->row_pointers != row_pointers))
      png_free_data(png_ptr, info_ptr, PNG_FREE_ROWS, 0);

   info_ptr->row_pointers = row_pointers;

   if (row_pointers != NULL)
      info_ptr->valid |= PNG_INFO_IDAT;
}